

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_current.cpp
# Opt level: O3

int cpptrace::detail::get_page_protections(void *page)

{
  uint uVar1;
  runtime_error *prVar2;
  istream *piVar3;
  uint uVar4;
  char x;
  char w;
  char r;
  uintptr_t stop;
  uintptr_t start;
  ifstream stream;
  char local_243;
  char local_242;
  char local_241;
  void *local_240;
  void *local_238;
  ulong local_230 [3];
  uint auStack_218 [2];
  uint auStack_210 [122];
  
  std::ifstream::ifstream(local_230,"/proc/self/maps",_S_in);
  *(uint *)((long)auStack_218 + *(long *)(local_230[0] - 0x18)) =
       *(uint *)((long)auStack_218 + *(long *)(local_230[0] - 0x18)) & 0xffffffb5 | 8;
  if ((*(byte *)((long)auStack_210 + *(long *)(local_230[0] - 0x18)) & 2) == 0) {
    do {
      std::istream::_M_extract<unsigned_long>(local_230);
      std::istream::ignore((long)local_230);
      std::istream::_M_extract<unsigned_long>(local_230);
      uVar4 = *(uint *)((long)auStack_210 + *(long *)(local_230[0] - 0x18));
      if ((uVar4 & 2) != 0) break;
      if ((uVar4 & 5) != 0) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"Failure reading /proc/self/maps");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((local_238 <= page) && (page < local_240)) {
        std::istream::ignore((long)local_230);
        piVar3 = std::operator>>((istream *)local_230,&local_241);
        piVar3 = std::operator>>(piVar3,&local_242);
        std::operator>>(piVar3,&local_243);
        if ((*(byte *)((long)auStack_210 + *(long *)(local_230[0] - 0x18)) & 7) == 0) {
          uVar4 = (local_241 == 'r') + 2;
          if (local_242 != 'w') {
            uVar4 = (uint)(local_241 == 'r');
          }
          uVar1 = uVar4 + 4;
          if (local_243 != 'x') {
            uVar1 = uVar4;
          }
          std::ifstream::~ifstream(local_230);
          return uVar1;
        }
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"Failure reading /proc/self/maps");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::istream::ignore((long)local_230,-1);
    } while ((*(byte *)((long)auStack_210 + *(long *)(local_230[0] - 0x18)) & 2) == 0);
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"Failed to find mapping with page in /proc/self/maps");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int get_page_protections(void* page) {
            auto page_addr = reinterpret_cast<uintptr_t>(page);
            std::ifstream stream("/proc/self/maps");
            stream>>std::hex;
            while(!stream.eof()) {
                uintptr_t start;
                uintptr_t stop;
                stream>>start;
                stream.ignore(1); // dash
                stream>>stop;
                if(stream.eof()) {
                    break;
                }
                if(stream.fail()) {
                    throw std::runtime_error("Failure reading /proc/self/maps");
                }
                if(page_addr >= start && page_addr < stop) {
                    stream.ignore(1); // space
                    char r, w, x; // there's a private/shared flag after these but we don't need it
                    stream>>r>>w>>x;
                    if(stream.fail() || stream.eof()) {
                        throw std::runtime_error("Failure reading /proc/self/maps");
                    }
                    int perms = 0;
                    if(r == 'r') {
                        perms |= PROT_READ;
                    }
                    if(w == 'w') {
                        perms |= PROT_WRITE;
                    }
                    if(x == 'x') {
                        perms |= PROT_EXEC;
                    }
                    // std::cerr<<"--parsed: "<<std::hex<<start<<" "<<stop<<" "<<r<<w<<x<<std::endl;
                    return perms;
                }
                stream.ignore(std::numeric_limits<std::streamsize>::max(), '\n');
            }
            throw std::runtime_error("Failed to find mapping with page in /proc/self/maps");
        }